

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::syntax::TokenList&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          ConditionalDirectiveExpressionSyntax *args_2,TokenList *args_3)

{
  Token directive;
  ConditionalBranchDirectiveSyntax *this_00;
  
  this_00 = (ConditionalBranchDirectiveSyntax *)allocate(this,0x68,8);
  directive.kind = args_1->kind;
  directive._2_1_ = args_1->field_0x2;
  directive.numFlags.raw = (args_1->numFlags).raw;
  directive.rawLen = args_1->rawLen;
  directive.info = args_1->info;
  syntax::ConditionalBranchDirectiveSyntax::ConditionalBranchDirectiveSyntax
            (this_00,*args,directive,args_2,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }